

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_event.h
# Opt level: O0

type __thiscall
miniros::MessageEvent<void_const>::copyMessageIfNecessary<void_const>
          (MessageEvent<const_void> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_void> *in_RDI;
  type tVar1;
  shared_ptr<void> *in_stack_ffffffffffffffc8;
  shared_ptr<const_void> *psVar2;
  
  psVar2 = in_RDI;
  std::const_pointer_cast<void,void_const>(in_RDI);
  std::shared_ptr<void_const>::shared_ptr<void,void>(in_RDI,in_stack_ffffffffffffffc8);
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)0x44f803);
  tVar1.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  tVar1.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = psVar2;
  return (type)tVar1.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

typename std::enable_if<std::is_void<M2>::value, std::shared_ptr<M> >::type copyMessageIfNecessary() const
  {
    return std::const_pointer_cast<Message>(message_);
  }